

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O1

void asio::detail::
     reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  uint *puVar1;
  func_type p_Var2;
  ptr p;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> handler;
  handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void> w;
  ptr local_a0;
  _Any_data local_88;
  func_type local_78;
  undefined8 local_70;
  scheduler_operation *local_68;
  func_type p_Stack_60;
  any_executor_base local_58;
  scheduler_operation *local_28;
  
  puVar1 = &base[4].task_result_;
  local_a0.h = (function<void_(const_std::error_code_&)> *)puVar1;
  local_a0.v = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
                *)base;
  local_a0.p = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
                *)base;
  if (owner != (void *)0x0) {
    reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
    ::do_assign((reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
                 *)base);
  }
  execution::detail::any_executor_base::any_executor_base(&local_58,(any_executor_base *)(base + 6))
  ;
  local_28 = base[8].next_;
  base[8].next_ =
       (scheduler_operation *)
       execution::
       any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
       ::prop_fns_table<void>()::fns;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = (scheduler_operation *)0x0;
  local_78 = (func_type)0x0;
  local_70 = *(undefined8 *)&base[5].task_result_;
  p_Var2 = base[5].func_;
  if (p_Var2 != (func_type)0x0) {
    local_88._M_unused._0_8_ = (undefined8)*(undefined8 *)puVar1;
    local_88._8_8_ = base[5].next_;
    base[5].func_ = (func_type)0x0;
    *(undefined8 *)&base[5].task_result_ = 0;
    local_78 = p_Var2;
  }
  local_68 = base[1].next_;
  p_Stack_60 = base[1].func_;
  local_a0.h = (function<void_(const_std::error_code_&)> *)&local_88;
  ptr::reset(&local_a0);
  if (owner != (void *)0x0) {
    handler_work<std::function<void(std::error_code_const&)>,asio::any_io_executor,void>::
    complete<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>
              ((handler_work<std::function<void(std::error_code_const&)>,asio::any_io_executor,void>
                *)&local_58,
               (binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *)&local_88,
               (function<void_(const_std::error_code_&)> *)&local_88);
  }
  if (local_78 != (func_type)0x0) {
    (*local_78)(&local_88,(scheduler_operation *)&local_88,(error_code *)0x3,(size_t)p_Var2);
  }
  if (local_58.target_ != (void *)0x0) {
    (*(local_58.object_fns_)->destroy)(&local_58);
  }
  ptr::reset(&local_a0);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    ASIO_ASSUME(base != 0);
    reactive_socket_accept_op* o(static_cast<reactive_socket_accept_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };

    // On success, assign new connection to peer socket object.
    if (owner)
      o->do_assign();

    ASIO_HANDLER_COMPLETION((*o));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        static_cast<handler_work<Handler, IoExecutor>&&>(
          o->work_));

    ASIO_ERROR_LOCATION(o->ec_);

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(o->handler_, o->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }